

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

int __thiscall
CNetBan::Ban<CNetBan::CBanPool<CNetRange,16>>
          (CNetBan *this,CBanPool<CNetRange,_16> *pBanPool,CDataType *pData,int Seconds,
          char *pReason)

{
  bool bVar1;
  int iVar2;
  IConsole *pIVar3;
  CBanPool<CNetRange,_16> *this_00;
  CBan<CNetRange> *pCVar4;
  int in_ECX;
  CNetRange *in_RDX;
  char *in_RSI;
  CNetBan *in_RDI;
  CDataType *in_R8;
  long in_FS_OFFSET;
  CBan<CNetRange> *pBan;
  int Stamp;
  int Time;
  CNetHash NetHash;
  char aBuf_1 [128];
  char aBuf [128];
  CBanInfo Info;
  CNetHash *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar5;
  undefined4 in_stack_fffffffffffffe78;
  CNetBan *pBan_00;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int iVar6;
  CNetHash local_160;
  undefined1 local_158 [128];
  undefined1 local_d8 [136];
  int local_50;
  int local_4c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pBan_00 = in_RDI;
  bVar1 = IsBannable<CNetRange>
                    (in_RDI,(CNetRange *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  if (bVar1) {
    iVar6 = time_timestamp();
    if (in_ECX < 1) {
      iVar2 = -1;
    }
    else {
      iVar2 = iVar6 + in_ECX;
    }
    iVar5 = iVar2;
    memset(&local_50,0,0x48);
    local_50 = iVar5;
    local_4c = iVar6;
    str_copy((char *)CONCAT44(iVar2,in_stack_fffffffffffffe50),(char *)in_stack_fffffffffffffe48,0);
    CNetHash::CNetHash(&local_160,in_RDX);
    this_00 = (CBanPool<CNetRange,_16> *)
              CBanPool<CNetRange,_16>::Find
                        ((CBanPool<CNetRange,_16> *)in_RDI,
                         (CDataType *)CONCAT44(iVar2,in_stack_fffffffffffffe50),
                         in_stack_fffffffffffffe48);
    if (this_00 == (CBanPool<CNetRange,_16> *)0x0) {
      pCVar4 = CBanPool<CNetRange,_16>::Add
                         ((CBanPool<CNetRange,_16> *)CONCAT44(in_ECX,in_stack_fffffffffffffe78),
                          in_R8,(CBanInfo *)CONCAT44(iVar6,iVar5),(CNetHash *)0x0);
      if (pCVar4 == (CBan<CNetRange> *)0x0) {
        pIVar3 = Console(in_RDI);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                  (pIVar3,0,"net_ban","ban failed (full banlist)");
        iVar6 = -1;
      }
      else {
        MakeBanInfo<CNetRange>
                  ((CNetBan *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (CBan<CNetRange> *)pBan_00,in_RSI,(uint)((ulong)in_RDX >> 0x20),(int)in_RDX,
                   (int *)CONCAT44(in_ECX,in_stack_fffffffffffffe78));
        pIVar3 = Console(in_RDI);
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,0,"net_ban",local_158);
        iVar6 = 0;
      }
    }
    else {
      CBanPool<CNetRange,_16>::Update
                (this_00,(CBan<CNetRange> *)in_RDI,
                 (CBanInfo *)CONCAT44(iVar2,in_stack_fffffffffffffe50));
      MakeBanInfo<CNetRange>
                ((CNetBan *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (CBan<CNetRange> *)pBan_00,in_RSI,(uint)((ulong)in_RDX >> 0x20),(int)in_RDX,
                 (int *)CONCAT44(in_ECX,in_stack_fffffffffffffe78));
      pIVar3 = Console(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,0,"net_ban",local_d8);
      iVar6 = 1;
    }
  }
  else {
    pIVar3 = Console(in_RDI);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
              (pIVar3,0,"net_ban","ban failed (localhost)");
    iVar6 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int CNetBan::Ban(T *pBanPool, const typename T::CDataType *pData, int Seconds, const char *pReason)
{
	// do not ban localhost
	if(!IsBannable(pData))
	{
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "ban failed (localhost)");
		return -1;
	}

	int Time = time_timestamp();
	int Stamp = Seconds > 0 ? Time+Seconds : CBanInfo::EXPIRES_NEVER;

	// set up info
	CBanInfo Info = {0};
	Info.m_Expires = Stamp;
	Info.m_LastInfoQuery = Time;
	str_copy(Info.m_aReason, pReason, sizeof(Info.m_aReason));

	// check if it already exists
	CNetHash NetHash(pData);
	CBan<typename T::CDataType> *pBan = pBanPool->Find(pData, &NetHash);
	if(pBan)
	{
		// adjust the ban
		pBanPool->Update(pBan, &Info);
		char aBuf[128];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 1;
	}

	// add ban and print result
	pBan = pBanPool->Add(pData, &Info, &NetHash);
	if(pBan)
	{
		char aBuf[128];
		MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_BANADD);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aBuf);
		return 0;
	}
	else
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", "ban failed (full banlist)");
	return -1;
}